

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstar.cpp
# Opt level: O0

void __thiscall DSDcc::DSDDstar::~DSDDstar(DSDDstar *this)

{
  DStarHeader *in_RDI;
  
  DStarHeader::~DStarHeader(in_RDI);
  CRC::~CRC((CRC *)&in_RDI->field_0x78);
  DStarCRC::~DStarCRC((DStarCRC *)&in_RDI->field_0x70);
  Viterbi3::~Viterbi3((Viterbi3 *)0x124369);
  return;
}

Assistant:

DSDDstar::~DSDDstar()
{
}